

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

size_t __thiscall leveldb::RecoveryTest::DeleteLogFiles(RecoveryTest *this)

{
  Env *pEVar1;
  Tester *this_00;
  ulong uVar2;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  Status local_218;
  string local_210;
  string local_1f0;
  Tester local_1d0;
  
  Close(this);
  GetFiles(&logs,this,kLogFile);
  for (uVar3 = 0;
      uVar2 = (long)logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3, uVar3 < uVar2; uVar3 = uVar3 + 1) {
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
               ,0x67);
    pEVar1 = this->env_;
    LogFileName(&local_1f0,&this->dbname_,
                logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3]);
    (*pEVar1->_vptr_Env[8])(&local_218,pEVar1,&local_1f0);
    this_00 = test::Tester::IsOk(&local_1d0,&local_218);
    LogFileName(&local_210,&this->dbname_,
                logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3]);
    test::Tester::operator<<(this_00,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    Status::~Status(&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    test::Tester::~Tester(&local_1d0);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return uVar2;
}

Assistant:

size_t DeleteLogFiles() {
    // Linux allows unlinking open files, but Windows does not.
    // Closing the db allows for file deletion.
    Close();
    std::vector<uint64_t> logs = GetFiles(kLogFile);
    for (size_t i = 0; i < logs.size(); i++) {
      ASSERT_OK(env_->DeleteFile(LogName(logs[i]))) << LogName(logs[i]);
    }
    return logs.size();
  }